

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# REFPROP_lib.h
# Opt level: O3

string * get_shared_lib_abi_cxx11_(void)

{
  return &shared_lib_LINUX_abi_cxx11_;
}

Assistant:

const std::string& get_shared_lib()
    {
#if defined(__RPISWINDOWS__)
    #if defined(_WIN64) || defined(__WIN64__)
        return shared_lib_WIN64;
    #elif defined(_WIN32) || defined(__WIN32__)
        return shared_lib_WIN32;
    #else
        if (sizeof(void*) == 8) { // Assume 64bit
            return shared_lib_WIN64;
        } else {
            return shared_lib_WIN32;
        }
    #endif  
#elif defined(__RPISLINUX__)
        return shared_lib_LINUX;
#elif defined(__RPISAPPLE__)
        return shared_lib_APPLE;
#endif
    }